

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

uint __thiscall
Js::ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>
          (Data *this,OpCodeAsmJs op,ByteCodeWriter *writer,bool isPatching)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar3 = OpCodeUtilAsmJs::IsValidByteCodeOpcode(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                ,0x11,"(OpCodeUtilAsmJs::IsValidByteCodeOpcode(op))",
                                "OpCodeUtilAsmJs::IsValidByteCodeOpcode(op)");
    if (!bVar3) goto LAB_00742227;
    *puVar4 = 0;
  }
  bVar3 = OpCodeAttrAsmJs::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                ,0x13,
                                "(layoutSize == SmallLayout || OpCodeAttrAsmJs::HasMultiSizeLayout(op))"
                                ,
                                "layoutSize == SmallLayout || OpCodeAttrAsmJs::HasMultiSizeLayout(op)"
                               );
    if (!bVar3) {
LAB_00742227:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  uVar1 = this->currentOffset;
  EncodeOpCode<(Js::LayoutSize)2>(this,op,writer);
  if ((ushort)(op - StartCall) < 0xfff8) {
    writer->m_byteCodeWithoutLDACount = writer->m_byteCodeWithoutLDACount + 1;
  }
  if (!isPatching) {
    IncreaseByteCodeCount(writer);
  }
  return uVar1;
}

Assistant:

inline uint ByteCodeWriter::Data::EncodeT(OpCodeAsmJs op, ByteCodeWriter* writer, bool isPatching)
    {
        Assert(OpCodeUtilAsmJs::IsValidByteCodeOpcode(op));

        Assert(layoutSize == SmallLayout || OpCodeAttrAsmJs::HasMultiSizeLayout(op));
        // Capture offset before encoding the opcode
        uint offset = GetCurrentOffset();
        EncodeOpCode<layoutSize>((ushort)op, writer);

        if (op > Js::OpCodeAsmJs::Ld_Db || op < Js::OpCodeAsmJs::Ld_IntConst)
        {
            writer->m_byteCodeWithoutLDACount++;
        }
        CompileAssert((int)Js::OpCodeAsmJs::Ld_Db - (int)Js::OpCodeAsmJs::Ld_IntConst == 7);

        if (!isPatching)
        {
            writer->IncreaseByteCodeCount();
        }
        return offset;
    }